

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_UnknownFieldsAll_Test::TestBody
          (ComparisonTest_UnknownFieldsAll_Test *this)

{
  UnknownFieldSet *pUVar1;
  pointer this_00;
  char *message;
  string_view value;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  string local_38;
  
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown1_,0xf3,0x7a);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown1_,0xf4,0x172356);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown1_,0xf4,0x98);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,1);
  this_00 = RepeatedField<google::protobuf::UnknownField>::Mutable
                      (&((this->super_ComparisonTest).unknown1_)->fields_,3);
  pUVar1 = UnknownField::mutable_group(this_00);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,2);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown1_,0xf9);
  UnknownFieldSet::AddFixed64(pUVar1,0xfa,1);
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown2_,0xf3,0x79);
  value._M_str = "test 123";
  value._M_len = 8;
  UnknownFieldSet::AddLengthDelimited((this->super_ComparisonTest).unknown2_,0x1209a,value);
  pUVar1 = UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf5);
  UnknownFieldSet::AddFixed32(pUVar1,0xf8,3);
  UnknownFieldSet::AddGroup((this->super_ComparisonTest).unknown2_,0xf7);
  protobuf::(anonymous_namespace)::ComparisonTest::RunUn_abi_cxx11_(&local_38,this);
  testing::internal::CmpHelperEQ<char[263],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"modified: 243[0]: 122 -> 121\\n\" \"deleted: 244[0]: 0x0000000000172356\\n\" \"deleted: 244[1]: 0x0000000000000098\\n\" \"modified: 245[0].248[0]: 0x00000001 -> 0x00000003\\n\" \"deleted: 245[0].248[1]: 0x00000002\\n\" \"added: 247[0]: { ... }\\n\" \"deleted: 249[0]: { ... }\\n\" \"added: 73882[0]: \\\"test 123\\\"\\n\""
             ,"RunUn()",
             (char (*) [263])
             "modified: 243[0]: 122 -> 121\ndeleted: 244[0]: 0x0000000000172356\ndeleted: 244[1]: 0x0000000000000098\nmodified: 245[0].248[0]: 0x00000001 -> 0x00000003\ndeleted: 245[0].248[1]: 0x00000002\nadded: 247[0]: { ... }\ndeleted: 249[0]: { ... }\nadded: 73882[0]: \"test 123\"\n"
             ,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xed1,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ComparisonTest, UnknownFieldsAll) {
  unknown1_->AddVarint(243, 122);
  unknown1_->AddFixed64(244, 0x0172356);
  unknown1_->AddFixed64(244, 0x098);
  unknown1_->AddGroup(245)->AddFixed32(248, 1);
  unknown1_->mutable_field(3)->mutable_group()->AddFixed32(248, 2);
  unknown1_->AddGroup(249)->AddFixed64(250, 1);

  unknown2_->AddVarint(243, 121);
  unknown2_->AddLengthDelimited(73882, "test 123");
  unknown2_->AddGroup(245)->AddFixed32(248, 3);
  unknown2_->AddGroup(247);

  EXPECT_EQ(
      "modified: 243[0]: 122 -> 121\n"
      "deleted: 244[0]: 0x0000000000172356\n"
      "deleted: 244[1]: 0x0000000000000098\n"
      "modified: 245[0].248[0]: 0x00000001 -> 0x00000003\n"
      "deleted: 245[0].248[1]: 0x00000002\n"
      "added: 247[0]: { ... }\n"
      "deleted: 249[0]: { ... }\n"
      "added: 73882[0]: \"test 123\"\n",
      RunUn());
}